

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_seeking.c
# Opt level: O0

void shift_cdata(test_state *state,uchar *cbuf_unshifted,int byte_offset,int bit_offset)

{
  aec_stream *paVar1;
  uchar *puVar2;
  ulong local_38;
  size_t i;
  uchar *dst;
  aec_stream *strm;
  int bit_offset_local;
  int byte_offset_local;
  uchar *cbuf_unshifted_local;
  test_state *state_local;
  
  paVar1 = state->strm;
  puVar2 = state->cbuf;
  memset(state->cbuf,0,state->buf_len);
  for (local_38 = 0; local_38 < paVar1->avail_in; local_38 = local_38 + 1) {
    puVar2[local_38 + (long)byte_offset] =
         puVar2[local_38 + (long)byte_offset] |
         (byte)((int)(uint)cbuf_unshifted[local_38] >> ((byte)bit_offset & 0x1f));
    puVar2[local_38 + (long)byte_offset + 1] =
         puVar2[local_38 + (long)byte_offset + 1] |
         cbuf_unshifted[local_38] << (8 - (byte)bit_offset & 0x1f);
  }
  return;
}

Assistant:

void shift_cdata(struct test_state *state, unsigned char *cbuf_unshifted,
                 int byte_offset, int bit_offset)
{
    struct aec_stream *strm = state->strm;
    unsigned char *dst = state->cbuf + byte_offset;

    memset(state->cbuf, 0, state->buf_len);
    for (size_t i = 0; i < strm->avail_in; i++) {
        dst[i] |= cbuf_unshifted[i] >> bit_offset;
        dst[i + 1] |= cbuf_unshifted[i] << (8 - bit_offset);
    }
}